

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O1

int PrintOutput(void *mem,sunrealtype t,N_Vector y)

{
  undefined8 *puVar1;
  int iVar2;
  int kused;
  sunrealtype hused;
  long nst;
  uint local_3c;
  undefined8 local_38;
  undefined8 local_30;
  
  puVar1 = (undefined8 *)N_VGetArrayPointer(y);
  IDAGetLastOrder(mem,&local_3c);
  IDAGetNumSteps(mem,&local_30);
  IDAGetLastStep(mem,&local_38);
  iVar2 = printf("%10.4e %12.4e %12.4e %12.4e %3ld  %1d %12.4e\n",t,*puVar1,puVar1[1],puVar1[2],
                 local_38,local_30,(ulong)local_3c);
  return iVar2;
}

Assistant:

static int PrintOutput(void* mem, sunrealtype t, N_Vector y)
{
  sunrealtype* yval;
  int retval, kused;
  long int nst;
  sunrealtype hused;

  yval = N_VGetArrayPointer(y);

  retval = IDAGetLastOrder(mem, &kused);
  retval = IDAGetNumSteps(mem, &nst);
  retval = IDAGetLastStep(mem, &hused);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%10.4Le %12.4Le %12.4Le %12.4Le %3ld  %1d %12.4Le\n", t, yval[0],
         yval[1], yval[2], nst, kused, hused);
#else
  printf("%10.4e %12.4e %12.4e %12.4e %3ld  %1d %12.4e\n", t, yval[0], yval[1],
         yval[2], nst, kused, hused);
#endif

  return (retval);
}